

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O2

void __thiscall features::Surf::extrema_detection(Surf *this)

{
  float *pfVar1;
  float fVar2;
  pointer pOVar3;
  int iVar4;
  int y;
  int y_00;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long local_68;
  ConstPtr ss;
  
  uVar5 = 0;
  while( true ) {
    pOVar3 = (this->octaves).
             super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->octaves).
                       super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3) / 0x18) <= uVar5)
    break;
    lVar7 = **(long **)&pOVar3[uVar5].imgs.
                        super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                        ._M_impl;
    lVar9 = (long)*(int *)(lVar7 + 8);
    iVar4 = *(int *)(lVar7 + 0xc);
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    ss.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar9 * 4);
    for (lVar7 = 1; lVar7 != 3; lVar7 = lVar7 + 1) {
      std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<core::Image<float>,void>
                ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)
                 (lVar7 * 0x10 +
                 *(long *)&(this->octaves).
                           super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar5].imgs.
                           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                           ._M_impl));
      lVar8 = *(long *)(local_68 + 0x18);
      for (y_00 = 0; y_00 != iVar4; y_00 = y_00 + 1) {
        for (lVar6 = 2; lVar6 < lVar9; lVar6 = lVar6 + 1) {
          fVar2 = *(float *)(lVar8 + -4 + lVar6 * 4);
          pfVar1 = (float *)(lVar8 + -8 + lVar6 * 4);
          if ((*pfVar1 <= fVar2 && fVar2 != *pfVar1) &&
             (pfVar1 = (float *)(lVar8 + lVar6 * 4), *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
            check_maximum(this,(int)uVar5,(int)lVar7,(int)lVar6 + -1,y_00);
          }
        }
        lVar8 = (long)&(ss.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar8;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ss);
    }
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void
Surf::extrema_detection (void)
{
    /*
     * At this stage each octave contains 4 scale space samples and local
     * maxima/minima in the approximated DoG function need to be found.
     * To this end, a simple non-maximum suppression technique is applied.
     */
    for (std::size_t o = 0; o < this->octaves.size(); ++o)
    {
        int const width = this->octaves[o].imgs[0]->width();
        int const height = this->octaves[o].imgs[0]->height();
        for (std::size_t s = 1; s < 3; ++s)
        {
            Octave::RespImage::ConstPtr ss = this->octaves[o].imgs[s];
            Octave::RespType const* ptr = &ss->at(0);
            for (int y = 0; y < height; ++y, ptr += width)
                for (int x = 1; x + 1 < width; ++x)
                    if (ptr[x] > ptr[x-1] && ptr[x] > ptr[x + 1])
                        this->check_maximum(o, s, x, y);
        }
    }
}